

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

bool __thiscall
llama_model_loader::get_key<llama_pooling_type>
          (llama_model_loader *this,llm_kv kid,llama_pooling_type *result,bool required)

{
  bool bVar1;
  uint32_t tmp;
  
  bVar1 = get_key<unsigned_int>(this,kid,&tmp,required);
  if (!bVar1) {
    tmp = LLAMA_POOLING_TYPE_UNSPECIFIED;
  }
  *result = tmp;
  return bVar1;
}

Assistant:

bool llama_model_loader::get_key(enum llm_kv kid, enum llama_pooling_type & result, bool required) {
        uint32_t tmp;
        const bool found = get_key(kid, tmp, required);
        if (found) {
            result = (enum llama_pooling_type) tmp;
        } else {
            result = LLAMA_POOLING_TYPE_UNSPECIFIED;
        }
        return found;
    }